

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O3

int Fra_OneHotRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  
  pAVar4 = p->pManAig;
  if (p->pSml->pAig != pAVar4) {
    __assert_fail("p->pSml->pAig == p->pManAig",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                  ,0x10f,"int Fra_OneHotRefineUsingCex(Fra_Man_t *, Vec_Int_t *)");
  }
  iVar10 = vOneHots->nSize;
  if (iVar10 < 1) {
    iVar11 = 0;
  }
  else {
    iVar14 = pAVar4->nObjs[2] - pAVar4->nRegs;
    lVar13 = 0;
    iVar11 = 0;
    do {
      if ((long)iVar10 <= lVar13 + 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vOneHots->pArray[lVar13];
      uVar2 = vOneHots->pArray[lVar13 + 1];
      if (uVar1 != 0 || uVar2 != 0) {
        uVar8 = ~uVar1;
        if (0 < (int)uVar1) {
          uVar8 = uVar1 - 1;
        }
        uVar8 = uVar8 + iVar14;
        if ((int)uVar8 < 0) {
LAB_0090fba1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pVVar5 = p->pManAig->vCis;
        uVar3 = pVVar5->nSize;
        if ((int)uVar3 <= (int)uVar8) goto LAB_0090fba1;
        uVar12 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar12 = uVar2 - 1;
        }
        uVar12 = uVar12 + iVar14;
        if (((int)uVar12 < 0) || (uVar3 <= uVar12)) goto LAB_0090fba1;
        ppvVar6 = pVVar5->pArray;
        iVar9 = Fra_OneHotNodesAreClause
                          (p->pSml,(Aig_Obj_t *)ppvVar6[uVar8],(Aig_Obj_t *)ppvVar6[uVar12],
                           uVar1 >> 0x1f,uVar2 >> 0x1f);
        iVar10 = vOneHots->nSize;
        if (iVar9 == 0) {
          if (iVar10 <= lVar13) {
LAB_0090fbdf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar7 = vOneHots->pArray;
          piVar7[lVar13] = 0;
          if ((long)vOneHots->nSize <= lVar13 + 1) goto LAB_0090fbdf;
          piVar7[lVar13 + 1] = 0;
          iVar10 = vOneHots->nSize;
          iVar11 = 1;
        }
      }
      lVar13 = lVar13 + 2;
    } while ((int)lVar13 < iVar10);
  }
  return iVar11;
}

Assistant:

int Fra_OneHotRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, Out1, Out2, RetValue = 0;
    int nPiNum = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    assert( p->pSml->pAig == p->pManAig );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        // get the corresponding nodes
        pObj1 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out2) );
        // check if implication holds using this simulation info
        if ( !Fra_OneHotNodesAreClause( p->pSml, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) ) )
        {
            Vec_IntWriteEntry( vOneHots, i, 0 );
            Vec_IntWriteEntry( vOneHots, i+1, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}